

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_10a000::pp_lifo::emplace(pp_lifo *this,int variable,bool value)

{
  pointer __src;
  ulong uVar1;
  pointer ppVar2;
  pointer ppVar3;
  ulong uVar4;
  long lVar5;
  pointer ppVar6;
  ulong uVar7;
  ulong __n;
  
  __src = (this->data).
          super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->data).
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)ppVar2 - (long)__src;
  ppVar3 = __src;
  if (0 < (long)__n >> 5) {
    ppVar3 = (pointer)((long)&__src->index + (__n & 0xffffffffffffffe0));
    lVar5 = ((long)__n >> 5) + 1;
    ppVar6 = __src + 2;
    do {
      if (ppVar6[-2].index == variable) {
        ppVar6 = ppVar6 + -2;
        goto LAB_001345c1;
      }
      if (ppVar6[-1].index == variable) {
        ppVar6 = ppVar6 + -1;
        goto LAB_001345c1;
      }
      if (ppVar6->index == variable) goto LAB_001345c1;
      if (ppVar6[1].index == variable) {
        ppVar6 = ppVar6 + 1;
        goto LAB_001345c1;
      }
      lVar5 = lVar5 + -1;
      ppVar6 = ppVar6 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)ppVar2 - (long)ppVar3 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppVar6 = ppVar2;
      if ((lVar5 != 3) || (ppVar6 = ppVar3, ppVar3->index == variable)) goto LAB_001345c1;
      ppVar3 = ppVar3 + 1;
    }
    ppVar6 = ppVar3;
    if (ppVar3->index == variable) goto LAB_001345c1;
    ppVar3 = ppVar3 + 1;
  }
  ppVar6 = ppVar3;
  if (ppVar3->index != variable) {
    ppVar6 = ppVar2;
  }
LAB_001345c1:
  if (ppVar6 == ppVar2) {
    if (ppVar2 == (this->data).
                  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if (__n == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = (long)__n >> 3;
      uVar1 = 1;
      if (ppVar2 != __src) {
        uVar1 = uVar7;
      }
      uVar4 = uVar1 + uVar7;
      if (0xffffffffffffffe < uVar4) {
        uVar4 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar1,uVar7)) {
        uVar4 = 0xfffffffffffffff;
      }
      if (uVar4 == 0) {
        ppVar2 = (pointer)0x0;
      }
      else {
        ppVar2 = (pointer)operator_new(uVar4 * 8);
      }
      ppVar2[uVar7].index = variable;
      ppVar2[uVar7].value = value;
      if (0 < (long)__n) {
        memmove(ppVar2,__src,__n);
      }
      if (__src != (pointer)0x0) {
        operator_delete(__src,(long)(this->data).
                                    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src
                       );
      }
      (this->data).
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar2;
      (this->data).
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppVar2 + __n + 8);
      ppVar2 = ppVar2 + uVar4;
      (this->data).
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
    }
    else {
      ppVar2->index = variable;
      ppVar2->value = value;
      ppVar2 = ppVar2 + 1;
      (this->data).
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
    }
  }
  return SUB81(ppVar2,0);
}

Assistant:

bool emplace(int variable, bool value)
    {
        auto it = std::find_if(
          data.cbegin(), data.cend(), [&variable](const auto& elem) {
              return elem.index == variable;
          });

        if (it != data.cend())
            return false;

        data.emplace_back(variable, value);

        return true;
    }